

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_bpcc(opj_jp2_t *jp2,opj_cio_t *cio)

{
  uint uVar1;
  int iVar2;
  opj_cio_t *in_RSI;
  undefined8 *in_RDI;
  opj_common_ptr cinfo;
  opj_jp2_box_t box;
  uint i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  opj_cio_t *cio_00;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_20;
  uint local_1c;
  opj_bool local_4;
  
  cio_00 = (opj_cio_t *)*in_RDI;
  jp2_read_boxhdr((opj_common_ptr)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  cio_00,(opj_jp2_box_t *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (in_stack_ffffffffffffffdc == 0x62706363) {
    for (local_1c = 0; local_1c < *(uint *)(in_RDI + 3); local_1c = local_1c + 1) {
      uVar1 = cio_read(cio_00,in_stack_ffffffffffffffcc);
      *(uint *)(in_RDI[10] + (ulong)local_1c * 0xc + 8) = uVar1;
    }
    iVar2 = cio_tell(in_RSI);
    if (iVar2 - local_20 == in_stack_ffffffffffffffd8) {
      local_4 = 1;
    }
    else {
      opj_event_msg((opj_common_ptr)cio_00,1,"Error with BPCC Box\n");
      local_4 = 0;
    }
  }
  else {
    opj_event_msg((opj_common_ptr)cio_00,1,"Expected BPCC Marker\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static opj_bool jp2_read_bpcc(opj_jp2_t *jp2, opj_cio_t *cio) {
	unsigned int i;
	opj_jp2_box_t box;

	opj_common_ptr cinfo = jp2->cinfo;

	jp2_read_boxhdr(cinfo, cio, &box);
	if (JP2_BPCC != box.type) {
		opj_event_msg(cinfo, EVT_ERROR, "Expected BPCC Marker\n");
		return OPJ_FALSE;
	}

	for (i = 0; i < jp2->numcomps; i++) {
		jp2->comps[i].bpcc = cio_read(cio, 1);
	}

	if (cio_tell(cio) - box.init_pos != box.length) {
		opj_event_msg(cinfo, EVT_ERROR, "Error with BPCC Box\n");
		return OPJ_FALSE;
	}

	return OPJ_TRUE;
}